

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeffects.cpp
# Opt level: O0

void __thiscall QRollEffect::run(QRollEffect *this,int time)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  QWidget *pQVar4;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  WidgetAttribute unaff_retaddr_00;
  QWidget *in_stack_00000008;
  offset_in_QTimer_to_subr in_stack_00000010;
  int dist;
  code *this_00;
  int local_40;
  Connection in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x596b42);
  if (bVar2) {
    *(undefined4 *)(in_RDI + 0x48) = in_ESI;
    *(undefined4 *)(in_RDI + 0x4c) = 0;
    if (*(int *)(in_RDI + 0x48) < 0) {
      local_40 = 0;
      if ((*(uint *)(in_RDI + 0x54) & 3) != 0) {
        local_40 = *(int *)(in_RDI + 0x44) - *(int *)(in_RDI + 0x3c);
      }
      if ((*(uint *)(in_RDI + 0x54) & 0xc) != 0) {
        local_40 = (*(int *)(in_RDI + 0x40) - *(int *)(in_RDI + 0x38)) + local_40;
      }
      in_stack_fffffffffffffff4 = local_40 / 3;
      in_stack_fffffffffffffff0 = 0x32;
      piVar3 = qMax<int>((int *)&stack0xfffffffffffffff4,(int *)&stack0xfffffffffffffff0);
      in_stack_ffffffffffffffec = 0x78;
      piVar3 = qMin<int>(piVar3,(int *)&stack0xffffffffffffffec);
      *(int *)(in_RDI + 0x48) = *piVar3;
    }
    this_00 = QTimer::timeout;
    QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QRollEffect::*)()>
              ((Object *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_00000010,
               (ContextType *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               (offset_in_QRollEffect_to_subr *)in_stack_ffffffffffffffe0.d_ptr,(ConnectionType)this
              );
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffe0);
    pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x596c6f);
    QWidget::geometry(pQVar4);
    QRect::x((QRect *)0x596c7f);
    pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x596c91);
    QWidget::geometry(pQVar4);
    QRect::y((QRect *)0x596ca1);
    QWidget::move((QWidget *)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    qMin<int>((int *)(in_RDI + 0x3c),(int *)(in_RDI + 0x44));
    qMin<int>((int *)(in_RDI + 0x38),(int *)(in_RDI + 0x40));
    QWidget::resize((QWidget *)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x596cff);
    QWidget::setAttribute(in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x596d1f);
    QWidget::setAttribute(in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
    QWidget::show((QWidget *)this_00);
    QWidget::setEnabled((QWidget *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
    *(undefined1 *)(in_RDI + 0x51) = 1;
    *(undefined1 *)(in_RDI + 0x50) = 0;
    QTimer::start((int)in_RDI + 0x58);
    QElapsedTimer::start();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRollEffect::run(int time)
{
    if (!widget)
        return;

    duration  = time;
    elapsed = 0;

    if (duration < 0) {
        int dist = 0;
        if (orientation & (RightScroll|LeftScroll))
            dist += totalWidth - currentWidth;
        if (orientation & (DownScroll|UpScroll))
            dist += totalHeight - currentHeight;
        duration = qMin(qMax(dist/3, 50), 120);
    }

    connect(&anim, &QTimer::timeout, this, &QRollEffect::scroll);

    move(widget->geometry().x(),widget->geometry().y());
    resize(qMin(currentWidth, totalWidth), qMin(currentHeight, totalHeight));

    //This is roughly equivalent to calling setVisible(true) without actually showing the widget
    widget->setAttribute(Qt::WA_WState_ExplicitShowHide, true);
    widget->setAttribute(Qt::WA_WState_Hidden, false);

    show();
    setEnabled(false);

    showWidget = true;
    done = false;
    anim.start(1);
    checkTime.start();
}